

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BN.cpp
# Opt level: O2

BN * __thiscall BN::operator-(BN *__return_storage_ptr__,BN *this,BN *bn)

{
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_30;
  
  BN((BN *)&local_30,this);
  operator-=((BN *)&local_30,bn);
  BN(__return_storage_ptr__,(BN *)&local_30);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

const BN BN::operator - (const BN& bn) const
{
    return move(BN(*this) -= bn);
}